

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

void __thiscall TypeOpBoolXor::TypeOpBoolXor(TypeOpBoolXor *this,TypeFactory *t)

{
  OpBehavior *pOVar1;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"^^","");
  TypeOp::TypeOp((TypeOp *)this,t,CPUI_BOOL_XOR,&local_38);
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c09d0;
  (this->super_TypeOpBinary).metaout = TYPE_BOOL;
  (this->super_TypeOpBinary).metain = TYPE_BOOL;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  (this->super_TypeOpBinary).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_003c1068;
  (this->super_TypeOpBinary).super_TypeOp.opflags = 0x14080;
  pOVar1 = (OpBehavior *)operator_new(0x10);
  pOVar1->opcode = CPUI_BOOL_XOR;
  pOVar1->isunary = false;
  pOVar1->isspecial = false;
  pOVar1->_vptr_OpBehavior = (_func_int **)&PTR__OpBehavior_003cbb70;
  (this->super_TypeOpBinary).super_TypeOp.behave = pOVar1;
  return;
}

Assistant:

TypeOpBoolXor::TypeOpBoolXor(TypeFactory *t)
  : TypeOpBinary(t,CPUI_BOOL_XOR,"^^",TYPE_BOOL,TYPE_BOOL)
{
  opflags = PcodeOp::binary | PcodeOp::commutative | PcodeOp::booloutput;
  behave = new OpBehaviorBoolXor();
}